

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

void xmlXPtrRangeInsideFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  int *piVar3;
  int *piVar4;
  xmlGenericErrorFunc p_Var5;
  int endindex;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr obj;
  xmlLocationSetPtr val;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlNodePtr cur;
  int startindex;
  xmlNodePtr pxVar9;
  long lVar10;
  int iStack_40;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iStack_40 = 0xc;
    goto LAB_001e0d76;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iStack_40 = 0x17;
    goto LAB_001e0d76;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
    iStack_40 = 0xb;
    goto LAB_001e0d76;
  }
  pxVar6 = valuePop(ctxt);
  obj = pxVar6;
  if (pxVar6->type == XPATH_NODESET) {
    obj = xmlXPtrNewLocationSetNodeSet(pxVar6->nodesetval);
    xmlXPathFreeObject(pxVar6);
    if (obj != (xmlXPathObjectPtr)0x0) goto LAB_001e0c1f;
  }
  else {
LAB_001e0c1f:
    val = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
    if (val != (xmlLocationSetPtr)0x0) {
      piVar3 = (int *)obj->user;
      if (piVar3 != (int *)0x0) {
        for (lVar10 = 0; lVar10 < *piVar3; lVar10 = lVar10 + 1) {
          piVar4 = *(int **)(*(long *)(piVar3 + 2) + lVar10 * 8);
          if (((piVar4 == (int *)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) ||
             (ctxt->context->doc == (xmlDocPtr)0x0)) goto LAB_001e0cd9;
          if (*piVar4 == 6) {
            pxVar9 = *(xmlNodePtr *)(piVar4 + 10);
            cur = *(xmlNodePtr *)(piVar4 + 0xe);
            if (cur == (xmlNodePtr)0x0) goto LAB_001e0c96;
            startindex = piVar4[0xc];
            endindex = piVar4[0x10];
LAB_001e0d12:
            pxVar6 = xmlXPtrNewRange(pxVar9,startindex,cur,endindex);
          }
          else {
            if (*piVar4 == 5) {
              pxVar9 = *(xmlNodePtr *)(piVar4 + 10);
LAB_001e0c96:
              cur = pxVar9;
              xVar2 = cur->type;
              if (xVar2 < XML_DTD_NODE) {
                pxVar9 = cur;
                if ((0x3226U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
                  endindex = xmlXPtrGetArity(cur);
LAB_001e0d08:
                  startindex = 0;
                  goto LAB_001e0d12;
                }
                pxVar6 = (xmlXPathObjectPtr)0x0;
                if ((0x198U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
                  if (cur->content == (xmlChar *)0x0) {
                    startindex = 0;
                    endindex = 0;
                    goto LAB_001e0d12;
                  }
                  endindex = xmlStrlen(cur->content);
                  goto LAB_001e0d08;
                }
                goto LAB_001e0cdb;
              }
            }
            else {
              pp_Var7 = __xmlGenericError();
              p_Var5 = *pp_Var7;
              ppvVar8 = __xmlGenericErrorContext();
              (*p_Var5)(*ppvVar8,"Unimplemented block at %s:%d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                        ,0x868);
            }
LAB_001e0cd9:
            pxVar6 = (xmlXPathObjectPtr)0x0;
          }
LAB_001e0cdb:
          xmlXPtrLocationSetAdd(val,pxVar6);
        }
      }
      pxVar6 = xmlXPtrWrapLocationSet(val);
      valuePush(ctxt,pxVar6);
      xmlXPathFreeObject(obj);
      return;
    }
    xmlXPathFreeObject(obj);
  }
  iStack_40 = 0xf;
LAB_001e0d76:
  xmlXPathErr(ctxt,iStack_40);
  return;
}

Assistant:

static void
xmlXPtrRangeInsideFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i;
    xmlXPathObjectPtr set;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    set = valuePop(ctxt);
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL)
	     XP_ERROR(XPATH_MEMORY_ERROR)
	set = tmp;
    }

    /*
     * The loop is to compute the covering range for each item and add it
     */
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(set);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    oldset = (xmlLocationSetPtr) set->user;
    if (oldset != NULL) {
        for (i = 0;i < oldset->locNr;i++) {
            xmlXPtrLocationSetAdd(newset,
                    xmlXPtrInsideRange(ctxt, oldset->locTab[i]));
        }
    }

    /*
     * Save the new value and cleanup
     */
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
}